

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O3

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_2,_1,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_1> *lhs,long depth,long rows,
            long stride,long offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  double *pdVar17;
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  long m;
  double *pdVar26;
  double *pdVar27;
  uint uVar28;
  double *pdVar29;
  double *pdVar30;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  double *local_90;
  
  if (stride != 0 || offset != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x71c,
                  "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 1>, 4, 2, 1>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 1>, Pack1 = 4, Pack2 = 2, StorageOrder = 1, Conjugate = false, PanelMode = false]"
                 );
  }
  uVar16 = 4;
  lVar24 = 0;
  lVar25 = 0;
  do {
    lVar22 = rows - (rows - lVar25) % (long)uVar16;
    uVar28 = (uint)uVar16;
    if (lVar25 < lVar22) {
      local_98 = lVar25 * 8;
      lVar20 = uVar16 * 8;
      local_a0 = lVar25 * 8 + 0x18;
      local_a8 = lVar25 * 8 + 0x10;
      local_b0 = lVar25 * 8 + 8;
      do {
        if (uVar16 == 1 || depth < 2) {
          lVar21 = 0;
        }
        else {
          lVar21 = 0;
          do {
            uVar18 = 0;
            do {
              lVar4 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
              pdVar17 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data;
              pdVar23 = pdVar17 + lVar21 + (uVar18 + lVar25) * lVar4;
              uVar10 = *(undefined4 *)((long)pdVar23 + 4);
              uVar11 = *(undefined4 *)(pdVar23 + 1);
              uVar12 = *(undefined4 *)((long)pdVar23 + 0xc);
              pdVar17 = pdVar17 + lVar21 + (uVar18 + lVar25 + 1) * lVar4;
              uVar6 = *(undefined4 *)pdVar17;
              uVar7 = *(undefined4 *)((long)pdVar17 + 4);
              uVar8 = *(undefined4 *)(pdVar17 + 1);
              uVar9 = *(undefined4 *)((long)pdVar17 + 0xc);
              pdVar17 = blockA + lVar24 + uVar18;
              *(undefined4 *)pdVar17 = *(undefined4 *)pdVar23;
              *(undefined4 *)((long)pdVar17 + 4) = uVar10;
              *(undefined4 *)(pdVar17 + 1) = uVar6;
              *(undefined4 *)((long)pdVar17 + 0xc) = uVar7;
              pdVar17 = pdVar17 + uVar16;
              *(undefined4 *)pdVar17 = uVar11;
              *(undefined4 *)((long)pdVar17 + 4) = uVar12;
              *(undefined4 *)(pdVar17 + 1) = uVar8;
              *(undefined4 *)((long)pdVar17 + 0xc) = uVar9;
              uVar18 = uVar18 + 2;
            } while (uVar18 < uVar16);
            lVar24 = lVar24 + (ulong)(uVar28 * 2);
            lVar21 = lVar21 + 2;
          } while (lVar21 < (long)(depth - (depth >> 0x3f) & 0xfffffffffffffffeU));
        }
        if (lVar21 < depth) {
          pdVar23 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data;
          lVar4 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
          pdVar29 = (double *)(lVar4 * local_98 + (long)pdVar23);
          pdVar17 = (double *)(lVar4 * local_a0 + (long)pdVar23);
          local_90 = (double *)(lVar4 * local_a8 + (long)pdVar23);
          pdVar26 = (double *)(lVar4 * local_b0 + (long)pdVar23);
          pdVar23 = pdVar23 + lVar21;
          lVar14 = lVar21;
          do {
            if (uVar28 < 4) {
              uVar18 = 0;
            }
            else {
              uVar18 = 0;
              pdVar19 = pdVar17;
              pdVar15 = local_90;
              pdVar27 = pdVar26;
              pdVar30 = pdVar29;
              do {
                dVar1 = pdVar27[lVar21];
                dVar2 = pdVar15[lVar21];
                dVar3 = pdVar19[lVar21];
                blockA[lVar24 + uVar18] = pdVar30[lVar21];
                blockA[lVar24 + uVar18 + 1] = dVar1;
                blockA[lVar24 + uVar18 + 2] = dVar2;
                blockA[lVar24 + uVar18 + 3] = dVar3;
                uVar18 = uVar18 + 4;
                pdVar30 = pdVar30 + lVar4 * 4;
                pdVar19 = pdVar19 + lVar4 * 4;
                pdVar15 = pdVar15 + lVar4 * 4;
                pdVar27 = pdVar27 + lVar4 * 4;
              } while ((long)uVar18 < (long)(int)(uVar28 - 3));
              lVar24 = lVar24 + uVar18;
            }
            lVar13 = uVar16 - uVar18;
            if ((uVar18 <= uVar16 && lVar13 != 0) && (uVar16 & 3) != 0) {
              pdVar19 = (double *)((uVar18 + lVar25) * lVar4 * 8 + (long)pdVar23);
              do {
                blockA[lVar24] = *pdVar19;
                lVar24 = lVar24 + 1;
                pdVar19 = pdVar19 + lVar4;
                lVar13 = lVar13 + -1;
              } while (lVar13 != 0);
            }
            lVar14 = lVar14 + 1;
            pdVar29 = pdVar29 + 1;
            pdVar17 = pdVar17 + 1;
            local_90 = local_90 + 1;
            pdVar26 = pdVar26 + 1;
            pdVar23 = pdVar23 + 1;
          } while (lVar14 != depth);
        }
        lVar25 = lVar25 + uVar16;
        local_98 = local_98 + lVar20;
        local_a0 = local_a0 + lVar20;
        local_a8 = local_a8 + lVar20;
        local_b0 = local_b0 + lVar20;
      } while (lVar25 < lVar22);
    }
    uVar5 = (uint)(uVar16 != 2) * 2;
    if (3 < uVar28) {
      uVar5 = uVar28 - 2;
    }
    uVar16 = (ulong)uVar5;
  } while (0 < (int)uVar5);
  if (lVar25 < rows) {
    lVar22 = (lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
    pdVar23 = (double *)
              (lVar22 * 8 * lVar25 +
              (long)(lhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data);
    do {
      if (0 < depth) {
        lVar20 = 0;
        do {
          blockA[lVar24 + lVar20] = pdVar23[lVar20];
          lVar20 = lVar20 + 1;
        } while (depth != lVar20);
        lVar24 = lVar24 + lVar20;
      }
      lVar25 = lVar25 + 1;
      pdVar23 = pdVar23 + lVar22;
    } while (lVar25 != rows);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

//   const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
//   const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
//   const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;

  int pack = Pack1;
  Index i = 0;
  while(pack>0)
  {
    Index remaining_rows = rows-i;
    Index peeled_mc = i+(remaining_rows/pack)*pack;
    for(; i<peeled_mc; i+=pack)
    {
      if(PanelMode) count += pack * offset;

      const Index peeled_k = (depth/PacketSize)*PacketSize;
      Index k=0;
      if(pack>=PacketSize)
      {
        for(; k<peeled_k; k+=PacketSize)
        {
          for (Index m = 0; m < pack; m += PacketSize)
          {
            PacketBlock<Packet> kernel;
            for (int p = 0; p < PacketSize; ++p) kernel.packet[p] = lhs.loadPacket(i+p+m, k);
            ptranspose(kernel);
            for (int p = 0; p < PacketSize; ++p) pstore(blockA+count+m+(pack)*p, cj.pconj(kernel.packet[p]));
          }
          count += PacketSize*pack;
        }
      }
      for(; k<depth; k++)
      {
        Index w=0;
        for(; w<pack-3; w+=4)
        {
          Scalar a(cj(lhs(i+w+0, k))),
                 b(cj(lhs(i+w+1, k))),
                 c(cj(lhs(i+w+2, k))),
                 d(cj(lhs(i+w+3, k)));
          blockA[count++] = a;
          blockA[count++] = b;
          blockA[count++] = c;
          blockA[count++] = d;
        }
        if(pack%4)
          for(;w<pack;++w)
            blockA[count++] = cj(lhs(i+w, k));
      }

      if(PanelMode) count += pack * (stride-offset-depth);
    }

    pack -= PacketSize;
    if(pack<Pack2 && (pack+PacketSize)!=Pack2)
      pack = Pack2;
  }

  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}